

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_duration(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  void *pvVar9;
  Status SVar10;
  int iVar11;
  Status myStatus;
  StrX local_138;
  char iv_3 [12];
  char iv_2 [15];
  char v_3 [13];
  char iv_1 [16];
  char v_2 [21];
  char v_1 [22];
  undefined8 uStack_a8;
  undefined8 uStack_80;
  undefined8 uStack_58;
  int iVar12;
  
  builtin_strncpy(v_1,"   P1Y1M1DT1H1M1S   \n",0x16);
  builtin_strncpy(v_2,"P1Y1M31DT23H119M120S",0x15);
  builtin_strncpy(v_3 + 8,"T23H",5);
  builtin_strncpy(v_3,"-P1Y1M1D",8);
  builtin_strncpy(iv_1,"P-1Y2M3DT10H30M",0x10);
  builtin_strncpy(iv_2,"P1Y1M1DT1H1M1X",0xf);
  builtin_strncpy(iv_3,"P1Z1M1DT23H",0xc);
  myStatus = st_Init;
  StrX::StrX(&local_138,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe24,v_1,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe25,v_2,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe26,v_3,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe29,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_0011cde5;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe29,iv_1,local_138.fLocalForm,0);
LAB_0011cde5:
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe2a,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_0011cec3;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe2a,iv_2,local_138.fLocalForm,0);
LAB_0011cec3:
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_0011cfa7;
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    pcVar1 = local_138.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xe2b,iv_3,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xe2b,iv_3,local_138.fLocalForm,0);
  }
  StrX::~StrX(&local_138);
  errSeen = 1;
LAB_0011cfa7:
  iVar12 = 2;
  while (iVar11 = iVar12 + -1, iVar12 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_138,v_1);
    pvVar9 = (void *)0x5;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe45,v_1);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      expValue.fValue.f_double = 2.12199579145934e-314;
      expValue._0_8_ = uStack_80;
      expValue.fValue._8_8_ = 0x100000001;
      expValue.fValue._16_8_ = 0x100000001;
      expValue.fValue.f_datetime.f_milisec = 0.0;
      bVar3 = compareActualValue(dt_duration,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_138,v_2);
    pvVar9 = (void *)0x5;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe46,v_2);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      expValue_00.fValue.f_double = 2.12199579145934e-314;
      expValue_00._0_8_ = uStack_a8;
      expValue_00.fValue._8_8_ = 0x170000001f;
      expValue_00.fValue._16_8_ = 0x7800000077;
      expValue_00.fValue.f_datetime.f_milisec = 0.0;
      bVar3 = compareActualValue(dt_duration,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_138,v_3);
    pvVar9 = (void *)0x5;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe47,v_3);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_duration,*pXVar4,
                                 (XSValue_Data)
                                 ZEXT2440(CONCAT816(0xffffffe9ffffffff,
                                                    CONCAT88(0xffffffffffffffff,uStack_58))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_138,iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar1 = local_138.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4a,iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pvVar9 = (void *)0xe4a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4a,iv_1);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_138,iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar1 = local_138.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4b,iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pvVar9 = (void *)0xe4b;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4b,iv_2);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_138,iv_3);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    iVar12 = iVar11;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        pcVar1 = local_138.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xe4c,iv_3,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pvVar9 = (void *)0xe4c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xe4c,iv_3);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar12 = 2;
LAB_0011d616:
  iVar11 = iVar12 + -1;
  if (iVar12 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,v_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe68,v_1,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_138);
      goto LAB_0011d70e;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xe68,v_1);
    StrX::~StrX(&local_138);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0011d70e:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,v_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe69,v_2,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_138);
      goto LAB_0011d804;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xe69,v_2);
    StrX::~StrX(&local_138);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0011d804:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,v_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe6a,v_3,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_138);
      goto LAB_0011d8fa;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xe6a,v_3);
    StrX::~StrX(&local_138);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0011d8fa:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,iv_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar7 == 0) {
    SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
    if (SVar10 != myStatus) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(SVar10);
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe6e,iv_1,pcVar1,pcVar6,pcVar8);
      StrX::~StrX(&local_138);
      goto LAB_0011da08;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xe6e,iv_1);
    StrX::~StrX(&local_138);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0011da08:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,iv_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar7 == 0) {
    SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
    if (SVar10 != myStatus) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
      pcVar1 = local_138.fLocalForm;
      pcVar6 = getStatusString(SVar10);
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xe70,iv_2,pcVar1,pcVar6,pcVar8);
      StrX::~StrX(&local_138);
      goto LAB_0011db16;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xe70,iv_2);
    StrX::~StrX(&local_138);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0011db16:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_138,iv_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_138.fUnicodeForm,dt_duration,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar7 == 0) goto LAB_0011dbb2;
  StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0xe72,iv_3);
  StrX::~StrX(&local_138);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
  goto LAB_0011dc1b;
LAB_0011dbb2:
  SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
  iVar12 = iVar11;
  if (SVar10 != myStatus) {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
    pcVar1 = local_138.fLocalForm;
    pcVar6 = getStatusString(SVar10);
    pcVar8 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xe72,iv_3,pcVar1,pcVar6,pcVar8);
    StrX::~StrX(&local_138);
LAB_0011dc1b:
    errSeen = 1;
    iVar12 = iVar11;
  }
  goto LAB_0011d616;
}

Assistant:

void test_dt_duration()
{
    const XSValue::DataType dt = XSValue::dt_duration;
    bool  toValidate = true;

    const char v_1[]="   P1Y1M1DT1H1M1S   \n";
    const char v_2[]="P1Y1M31DT23H119M120S";
    const char v_3[]="-P1Y1M1DT23H";

    const char iv_1[]="P-1Y2M3DT10H30M";
    const char iv_2[]="P1Y1M1DT1H1M1X";
    const char iv_3[]="P1Z1M1DT23H";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;
    act_v_ran_v_1.fValue.f_datetime.f_year    = 1;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 1;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 1;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 1;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 1;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 1;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 1;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 119;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 120;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = -1;
    act_v_ran_v_3.fValue.f_datetime.f_month   = -1;
    act_v_ran_v_3.fValue.f_datetime.f_day     = -1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = -23;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}